

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<int,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),int(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ParameterDictionary *this,
          string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_int_double_ptr_FileLoc_ptr *convert)

{
  string *args;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *pPVar3;
  size_t __n;
  ulong uVar4;
  int iVar5;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *pvVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> *local_48;
  int local_40;
  int local_3c;
  char *local_38;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar7 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar7 = paVar1;
  }
  local_48 = __return_storage_ptr__;
  if (sVar2 != 0) {
    lVar10 = 0;
    local_40 = nPerItem;
    local_38 = typeName;
    do {
      pPVar3 = *(ParsedParameter **)((long)paVar7 + lVar10);
      __n = (pPVar3->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((args = &pPVar3->name, __n == 0 ||
           (iVar5 = bcmp((args->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar5 == 0)) &&
          (iVar5 = std::__cxx11::string::compare((char *)pPVar3), iVar5 == 0)))) {
        pvVar6 = (*getValues)(pPVar3);
        local_3c = local_40;
        uVar4 = pvVar6->nStored;
        if (uVar4 == 0) {
          ErrorExit<std::__cxx11::string_const&>(&pPVar3->loc,"No values provided for \"%s\".",args)
          ;
        }
        uVar8 = (ulong)local_40;
        if (uVar4 % uVar8 == 0) {
          pPVar3->lookedUp = true;
          std::vector<int,_std::allocator<int>_>::vector(local_48,uVar4 / uVar8,&local_49);
          if (uVar4 < uVar8) {
            return local_48;
          }
          lVar10 = 0;
          uVar9 = 0;
          do {
            iVar5 = (*convert)((double *)((long)pvVar6->ptr + lVar10),&pPVar3->loc);
            lVar10 = lVar10 + uVar8 * 8;
            (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] = iVar5;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar4 / uVar8);
          return local_48;
        }
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&pPVar3->loc,"Number of values provided for \"%s\" not a multiple of %d",args,
                   &local_3c);
      }
      lVar10 = lVar10 + 8;
    } while (sVar2 << 3 != lVar10);
  }
  (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return local_48;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}